

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

vector2 * vector2_get_reference_vector2(int id)

{
  vector2 *pvStack_10;
  int id_local;
  
  switch(id) {
  case 0:
    pvStack_10 = &_vector2_zero;
    break;
  case 1:
    pvStack_10 = &_vector2_unit_x;
    break;
  case 2:
    pvStack_10 = &_vector2_unit_y;
    break;
  case 3:
    pvStack_10 = &_vector2_unit_x_negative;
    break;
  case 4:
    pvStack_10 = &_vector2_unit_y_negative;
    break;
  case 5:
    pvStack_10 = &_vector2_one;
    break;
  default:
    pvStack_10 = &_vector2_zero;
  }
  return pvStack_10;
}

Assistant:

HYPAPI const struct vector2 *vector2_get_reference_vector2(int id)
{
	switch (id) {
	case HYP_REF_VECTOR2_ZERO:
		return &_vector2_zero;
	case HYP_REF_VECTOR2_ONE:
		return &_vector2_one;
	case HYP_REF_VECTOR2_UNIT_X:
		return &_vector2_unit_x;
	case HYP_REF_VECTOR2_UNIT_Y:
		return &_vector2_unit_y;
	case HYP_REF_VECTOR2_UNIT_X_NEGATIVE:
		return &_vector2_unit_x_negative;
	case HYP_REF_VECTOR2_UNIT_Y_NEGATIVE:
		return &_vector2_unit_y_negative;
	default:
		/* undefined case */
		return &_vector2_zero;
	}
}